

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorPicker::mousePressEvent(QColorPicker *this,QMouseEvent *m)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QPointF local_30;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = QSinglePointEvent::position((QSinglePointEvent *)m);
  QVar1 = QPointF::toPoint(&local_30);
  QVar2 = QWidget::contentsRect((QWidget *)this);
  local_20 = (QPoint)((ulong)(uint)(QVar1.xp.m_i.m_i - QVar2.x1.m_i) |
                     (long)QVar1 - (QVar2._0_8_ & 0xffffffff00000000) & 0xffffffff00000000);
  setCol(this,&local_20);
  newCol(this,this->hue,this->sat);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::mousePressEvent(QMouseEvent *m)
{
    QPoint p = m->position().toPoint() - contentsRect().topLeft();
    setCol(p);
    emit newCol(hue, sat);
}